

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O2

void __thiscall
btSoftBody::appendLink(btSoftBody *this,Node *node0,Node *node1,Material *mat,bool bcheckexist)

{
  Link *pLVar1;
  bool bVar2;
  long lVar3;
  undefined3 in_register_00000081;
  btScalar bVar4;
  btVector3 local_38;
  
  if ((CONCAT31(in_register_00000081,bcheckexist) != 0) &&
     (bVar2 = checkLink(this,node0,node1), bVar2)) {
    return;
  }
  appendLink(this,-1,mat);
  lVar3 = (long)(this->m_links).m_size;
  pLVar1 = (this->m_links).m_data;
  pLVar1[lVar3 + -1].m_n[0] = node0;
  pLVar1[lVar3 + -1].m_n[1] = node1;
  local_38 = operator-(&node0->m_x,&node1->m_x);
  bVar4 = btVector3::length(&local_38);
  pLVar1[lVar3 + -1].m_rl = bVar4;
  this->m_bUpdateRtCst = true;
  return;
}

Assistant:

void			btSoftBody::appendLink(	Node* node0,
									   Node* node1,
									   Material* mat,
									   bool bcheckexist)
{
	if((!bcheckexist)||(!checkLink(node0,node1)))
	{
		appendLink(-1,mat);
		Link&	l=m_links[m_links.size()-1];
		l.m_n[0]		=	node0;
		l.m_n[1]		=	node1;
		l.m_rl			=	(l.m_n[0]->m_x-l.m_n[1]->m_x).length();
		m_bUpdateRtCst=true;
	}
}